

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  result rVar8;
  type tVar9;
  decimal_fp<float> dVar10;
  byte bVar11;
  undefined8 extraout_RDX;
  size_t count;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint64_t error;
  ulong uVar15;
  uint64_t divisor;
  bool bVar16;
  fp fVar17;
  fp fVar18;
  decimal_fp<double> dVar19;
  ulong uStack_a0;
  uint local_88;
  int cached_exp10;
  fixed_handler handler;
  fp local_40;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x980,"value is negative");
  }
  uVar12 = (ulong)specs & 0xff00000000;
  bVar16 = uVar12 == 0x200000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar12 != 0x200000000) {
      handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
      buffer<char>::push_back(buf,(char *)&handler);
      local_88 = 0;
    }
    else {
      tVar9 = to_unsigned<int>(precision);
      buffer<char>::try_resize(buf,(ulong)tVar9);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      local_88 = -precision;
    }
  }
  else {
    uVar6 = specs._4_4_;
    if ((uVar6 >> 0x13 & 1) == 0) {
      iVar7 = snprintf_float<double>(value,precision,specs,buf);
      return iVar7;
    }
    if (precision < 0) {
      if ((uVar6 >> 0x12 & 1) == 0) {
        dVar19 = dragonbox::to_decimal<double>(value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar19.significand);
        local_88 = dVar19.exponent;
      }
      else {
        dVar10 = dragonbox::to_decimal<float>((float)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar10.significand);
        local_88 = dVar10.exponent;
      }
    }
    else {
      cached_exp10 = 0;
      fp::assign<double,_0>(&local_40,value);
      fVar17.f = (ulong)(uint)local_40.e;
      fVar17._8_8_ = extraout_RDX;
      fVar17 = normalize<0>((detail *)local_40.f,fVar17);
      fVar18 = get_cached_power(-0x7c - fVar17.e,&cached_exp10);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar18.f;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = fVar17.f;
      uVar15 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
      cVar4 = (char)fVar18.e + (char)fVar17.e;
      handler.precision = 0x2ff;
      if ((uint)precision < 0x2ff) {
        handler.precision = precision;
      }
      handler.buf = buf->ptr_;
      handler.size = 0;
      handler.exp10 = -cached_exp10;
      bVar11 = -cVar4;
      divisor = 1L << (bVar11 & 0x3f);
      uVar13 = uVar15 >> (bVar11 & 0x3f);
      handler.fixed = bVar16;
      if ((uint32_t)uVar13 == 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                    ,0x5ec,"");
      }
      if (uVar13 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                    ,0x5ed,"");
      }
      bVar11 = -cVar4 - 0x40;
      local_88 = count_digits((uint32_t)uVar13);
      rVar8 = fixed_handler::on_start
                        (&handler,*(long *)("fmt::detail::bigint::~bigint()" +
                                           (long)(int)local_88 * 8 + 0x1c) << (bVar11 & 0x3f),
                         uVar15 / 10,10,(int *)&local_88);
      if (rVar8 == more) {
        uVar1 = divisor - 1;
        uVar15 = uVar15 & uVar1;
        error = 1;
        do {
          uVar14 = local_88 - 1;
          switch((ulong)uVar14) {
          case 0:
            cVar4 = (char)uVar13;
            uVar13 = 0;
            goto LAB_003e26f2;
          case 1:
            uStack_a0 = 10;
            break;
          case 2:
            uStack_a0 = 100;
            break;
          case 3:
            uStack_a0 = 1000;
            break;
          case 4:
            uStack_a0 = 10000;
            break;
          case 5:
            uStack_a0 = 100000;
            break;
          case 6:
            uStack_a0 = 1000000;
            break;
          case 7:
            uStack_a0 = 10000000;
            break;
          case 8:
            uStack_a0 = 100000000;
            break;
          case 9:
            uStack_a0 = 1000000000;
            break;
          default:
            assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                        ,0x61f,"invalid number of digits");
          }
          cVar4 = (char)((uVar13 & 0xffffffff) / uStack_a0);
          uVar13 = (uVar13 & 0xffffffff) % uStack_a0;
LAB_003e26f2:
          local_88 = uVar14;
          rVar8 = fixed_handler::on_digit
                            (&handler,cVar4 + '0',
                             *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar14 * 8) <<
                             (bVar11 & 0x3f),(uVar13 << (bVar11 & 0x3f)) + uVar15,1,uVar14,true);
          if (rVar8 != more) goto LAB_003e2795;
        } while (0 < (int)local_88);
        do {
          uVar13 = uVar15 * 10;
          error = error * 10;
          uVar15 = uVar13 & uVar1;
          local_88 = local_88 - 1;
          rVar8 = fixed_handler::on_digit
                            (&handler,(char)(uVar13 >> (bVar11 & 0x3f)) + '0',divisor,uVar15,error,
                             local_88,false);
        } while (rVar8 == more);
      }
LAB_003e2795:
      if (rVar8 == error) {
        local_88 = local_88 + ~cached_exp10 + handler.size;
        fallback_format<double>
                  (value,handler.precision,(bool)((byte)((ulong)specs >> 0x32) & 1),buf,
                   (int *)&local_88);
      }
      else {
        local_88 = local_88 + handler.exp10;
        tVar9 = to_unsigned<int>(handler.size);
        buffer<char>::try_resize(buf,(ulong)tVar9);
      }
      if ((uVar6 >> 0x14 & 1) == 0 && uVar12 != 0x200000000) {
        sVar5 = buf->size_;
        uVar6 = local_88;
        do {
          local_88 = uVar6;
          count = sVar5;
          if (count == 0) break;
          sVar5 = count - 1;
          uVar6 = local_88 + 1;
        } while (buf->ptr_[count - 1] == '0');
        buffer<char>::try_resize(buf,count);
      }
    }
  }
  return local_88;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}